

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O2

SelectionSet * __thiscall
OpenMD::SelectionEvaluator::alphaHullInstruction
          (SelectionSet *__return_storage_ptr__,SelectionEvaluator *this,Token *instruction,
          int frame)

{
  RealType RVar1;
  bool bVar2;
  int iVar3;
  type_info *ptVar4;
  float fVar5;
  any alphaSpec;
  SelectionSet bs;
  allocator<char> local_71;
  any local_70;
  SelectionSet local_60;
  string local_48;
  
  createSelectionSets(&local_60,this);
  std::any::any(&local_70,&instruction->value);
  ptVar4 = std::any::type(&local_70);
  bVar2 = std::type_info::operator==(ptVar4,(type_info *)&float::typeinfo);
  if (bVar2) {
    fVar5 = std::any_cast<float>(&local_70);
  }
  else {
    ptVar4 = std::any::type(&local_70);
    bVar2 = std::type_info::operator==(ptVar4,(type_info *)&int::typeinfo);
    if (bVar2) {
      iVar3 = std::any_cast<int>(&local_70);
      fVar5 = (float)iVar3;
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,"casting error in alphaHullInstruction",&local_71);
      evalError(this,&local_48);
      std::__cxx11::string::~string((string *)&local_48);
      SelectionSet::clearAll(&local_60);
      fVar5 = 0.0;
    }
  }
  AlphaHullFinder::setAlpha(&this->alphaHullFinder,(double)fVar5);
  HullFinder::findHull((SelectionSet *)&local_48,&(this->alphaHullFinder).super_HullFinder,frame);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::_M_move_assign
            (&local_60.bitsets_,&local_48);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            ((vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_> *)&local_48);
  RVar1 = (this->alphaHullFinder).super_HullFinder.volume_;
  this->surfaceArea_ = (this->alphaHullFinder).super_HullFinder.surfaceArea_;
  this->hasSurfaceArea_ = true;
  this->volume_ = RVar1;
  this->hasVolume_ = true;
  SelectionSet::parallelReduce(__return_storage_ptr__,&local_60);
  std::any::reset(&local_70);
  std::vector<OpenMD::OpenMDBitSet,_std::allocator<OpenMD::OpenMDBitSet>_>::~vector
            (&local_60.bitsets_);
  return __return_storage_ptr__;
}

Assistant:

SelectionSet SelectionEvaluator::alphaHullInstruction(
      const Token& instruction, int frame) {
    SelectionSet bs = createSelectionSets();

    std::any alphaSpec = instruction.value;
    float alpha(0.0);
    if (alphaSpec.type() == typeid(float)) {
      alpha = std::any_cast<float>(alphaSpec);
    } else if (alphaSpec.type() == typeid(int)) {
      alpha = std::any_cast<int>(alphaSpec);
    } else {
      evalError("casting error in alphaHullInstruction");
      bs.clearAll();
    }

    alphaHullFinder.setAlpha(alpha);
    bs              = alphaHullFinder.findHull(frame);
    surfaceArea_    = alphaHullFinder.getSurfaceArea();
    hasSurfaceArea_ = true;
    volume_         = alphaHullFinder.getVolume();
    hasVolume_      = true;

    return bs.parallelReduce();
  }